

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

Fl_Type * Fl_Type_make(char *tn)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  Fl_Type *pFVar4;
  long lVar5;
  
  reading_file = 1;
  lVar5 = 0x18;
  do {
    plVar1 = *(long **)((long)&New_Menu[0].text + lVar5);
    if (plVar1 != (long *)0x0) {
      pcVar3 = (char *)(**(code **)(*plVar1 + 0x28))(plVar1);
      iVar2 = fl_ascii_strcasecmp(tn,pcVar3);
      if (iVar2 == 0) {
LAB_0019501b:
        pFVar4 = (Fl_Type *)(**(code **)(*plVar1 + 0x18))(plVar1);
        reading_file = 0;
        return pFVar4;
      }
      pcVar3 = (char *)(**(code **)(*plVar1 + 0x30))(plVar1);
      iVar2 = fl_ascii_strcasecmp(tn,pcVar3);
      if (iVar2 == 0) goto LAB_0019501b;
    }
    lVar5 = lVar5 + 0x38;
    if (lVar5 == 0xf30) {
      reading_file = 0;
      return (Fl_Type *)0x0;
    }
  } while( true );
}

Assistant:

Fl_Type *Fl_Type_make(const char *tn) {
  reading_file = 1; // makes labels be null
  Fl_Type *r = 0;
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (!m->user_data()) continue;
    Fl_Type *t = (Fl_Type*)(m->user_data());
    if (!fl_ascii_strcasecmp(tn,t->type_name())) {r = t->make(); break;}
    if (!fl_ascii_strcasecmp(tn,t->alt_type_name())) {r = t->make(); break;}
  }
  reading_file = 0;
  return r;
}